

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O2

int Abc_NtkMfs(Abc_Ntk_t *pNtk,Mfs_Par_t *pPars)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Mfs_Man_t *p;
  Vec_Int_t *pVVar6;
  Abc_Ntk_t *pAVar7;
  Aig_Man_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  Bdc_Man_t *pBVar10;
  Abc_Obj_t *pAVar11;
  Vec_Vec_t *p_00;
  ProgressBar *pPVar12;
  abctime aVar13;
  char *pString;
  int i;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar14;
  Mfs_Par_t *pPars_00;
  float fVar15;
  int local_5c;
  Bdc_Par_t Pars;
  
  Pars.fVeryVerbose = 0;
  Pars.nVarsMax = 0;
  Pars.fVerbose = 0;
  aVar5 = Abc_Clock();
  iVar4 = pNtk->nObjCounts[7];
  iVar1 = Abc_NtkGetTotalFanins(pNtk);
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsCore.c"
                  ,0x188,"int Abc_NtkMfs(Abc_Ntk_t *, Mfs_Par_t *)");
  }
  uVar2 = Abc_NtkGetFaninMax(pNtk);
  if (pPars->fResub == 0) {
    if ((int)uVar2 < 0xd) goto LAB_003b1146;
    uVar2 = 0xc;
  }
  else {
    if ((int)uVar2 < 9) goto LAB_003b1146;
    uVar2 = 8;
  }
  printf("Nodes with more than %d fanins will not be processed.\n",(ulong)uVar2);
LAB_003b1146:
  iVar3 = Abc_NtkToAig(pNtk);
  if (iVar3 == 0) {
    fwrite("Converting to AIGs has failed.\n",0x1f,1,_stdout);
    iVar4 = 0;
  }
  else {
    if (pNtk->ntkFunc != ABC_FUNC_AIG) {
      __assert_fail("Abc_NtkHasAig(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsCore.c"
                    ,0x1a2,"int Abc_NtkMfs(Abc_Ntk_t *, Mfs_Par_t *)");
    }
    p = Mfs_ManAlloc(pPars);
    p->pNtk = pNtk;
    p->nFaninMax = uVar2;
    if (pPars->fPower != 0) {
      pVVar6 = Abc_NtkPowerEstimate(pNtk,(uint)(pPars->fResub == 0));
      p->vProbs = pVVar6;
      fVar15 = Abc_NtkMfsTotalSwitching(pNtk);
      p->TotalSwitchingBeg = fVar15;
    }
    pAVar7 = (Abc_Ntk_t *)pNtk->pExcare;
    if (pAVar7 != (Abc_Ntk_t *)0x0) {
      if (pAVar7->vPis->nSize == pNtk->vCis->nSize) {
        pAVar7 = Abc_NtkStrash(pAVar7,0,0,0);
        pAVar8 = Abc_NtkToDar(pAVar7,0,0);
        p->pCare = pAVar8;
        Abc_NtkDelete(pAVar7);
        pVVar9 = Aig_ManSupportsInverse(p->pCare);
        p->vSuppsInv = pVVar9;
      }
      else {
        printf("The PI count of careset (%d) and logic network (%d) differ. Careset is not used.\n")
        ;
      }
    }
    if (p->pCare != (Aig_Man_t *)0x0) {
      printf("Performing optimization with %d external care clauses.\n",
             (ulong)(uint)p->pCare->nObjs[3]);
    }
    if (pPars->fResub == 0) {
      Pars.nVarsMax = 3;
      if (3 < (int)uVar2) {
        Pars.nVarsMax = uVar2;
      }
      Pars.fVerbose = pPars->fVerbose;
      pVVar6 = (Vec_Int_t *)calloc(1,0x10);
      p->vTruth = pVVar6;
      pBVar10 = Bdc_ManAlloc(&Pars);
      p->pManDec = pBVar10;
    }
    if (p->pCare != (Aig_Man_t *)0x0) {
      for (aVar14.pData = (void *)0x0; (long)aVar14.pData < (long)pNtk->vCis->nSize;
          aVar14.pData = aVar14.pData + 1) {
        pAVar11 = Abc_NtkCi(pNtk,aVar14.iData);
        pAVar11->field_5 = aVar14;
      }
    }
    Abc_NtkLevel(pNtk);
    pPars_00 = (Mfs_Par_t *)(ulong)(uint)pPars->nGrowthLevel;
    Abc_NtkStartReverseLevels(pNtk,pPars->nGrowthLevel);
    p->nTotalNodesBeg = iVar4;
    p->nTotalEdgesBeg = iVar1;
    if (pPars->fResub == 0) {
      pPVar12 = Extra_ProgressBarStart((FILE *)_stdout,pNtk->nObjCounts[7]);
      p_00 = Abc_NtkLevelize(pNtk);
      local_5c = 0;
      for (iVar4 = 1; iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
        pVVar9 = Vec_VecEntry(p_00,iVar4);
        if (p->pPars->fVeryVerbose == 0) {
          Extra_ProgressBarUpdate(pPVar12,local_5c,pString);
        }
        p->nNodesGainedLevel = 0;
        p->nTotConfLevel = 0;
        p->nTimeOutsLevel = 0;
        Abc_Clock();
        for (iVar1 = 0; iVar3 = pVVar9->nSize, iVar1 < iVar3; iVar1 = iVar1 + 1) {
          pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(pVVar9,iVar1);
          iVar3 = p->pPars->nDepthMax;
          if ((iVar3 != 0) && (iVar3 < (int)(*(uint *)&pAVar11->field_0x14 >> 0xc))) {
            iVar3 = pVVar9->nSize;
            break;
          }
          iVar3 = (pAVar11->vFanins).nSize;
          if (iVar3 <= (int)uVar2 && 1 < iVar3) {
            if (pPars->fResub == 0) {
              Abc_NtkMfsNode(p,pAVar11);
            }
            else {
              Abc_NtkMfsResub(p,pAVar11);
            }
          }
        }
        local_5c = local_5c + iVar3;
      }
      Extra_ProgressBarStop(pPVar12);
      for (iVar4 = 0; iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
        pVVar9 = Vec_VecEntry(p_00,iVar4);
        if (pVVar9 != (Vec_Ptr_t *)0x0) {
          Vec_PtrFree(pVVar9);
        }
      }
      Vec_PtrFree((Vec_Ptr_t *)p_00);
    }
    else if (pPars->fPower == 0) {
      pPVar12 = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
      for (iVar4 = 0; iVar4 < pNtk->vObjs->nSize; iVar4 = iVar4 + 1) {
        pAVar11 = Abc_NtkObj(pNtk,iVar4);
        if ((pAVar11 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar11->field_0x14 & 0xf) == 7)) {
          iVar1 = p->pPars->nDepthMax;
          if (((iVar1 == 0) || ((int)(*(uint *)&pAVar11->field_0x14 >> 0xc) <= iVar1)) &&
             (iVar3 = (pAVar11->vFanins).nSize, iVar3 <= (int)uVar2 && iVar3 >= 2)) {
            if (p->pPars->fVeryVerbose == 0) {
              Extra_ProgressBarUpdate
                        (pPVar12,iVar4,(char *)(ulong)CONCAT31((int3)((uint)iVar1 >> 8),iVar3 < 2));
            }
            if (pPars->fResub == 0) {
              Abc_NtkMfsNode(p,pAVar11);
            }
            else {
              Abc_NtkMfsResub(p,pAVar11);
            }
          }
        }
      }
      Extra_ProgressBarStop(pPVar12);
    }
    else {
      Abc_NtkMfsPowerResub(p,pPars_00);
    }
    Abc_NtkStopReverseLevels(pNtk);
    p->nTotalNodesEnd = pNtk->nObjCounts[7];
    iVar4 = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalEdgesEnd = iVar4;
    if (p->pCare != (Aig_Man_t *)0x0) {
      for (iVar4 = 0; iVar4 < pNtk->vCis->nSize; iVar4 = iVar4 + 1) {
        pAVar11 = Abc_NtkCi(pNtk,iVar4);
        (pAVar11->field_5).pData = (void *)0x0;
      }
    }
    if (pPars->fPower != 0) {
      fVar15 = Abc_NtkMfsTotalSwitching(pNtk);
      p->TotalSwitchingEnd = fVar15;
    }
    iVar4 = 1;
    aVar13 = Abc_Clock();
    p->timeTotal = aVar13 - aVar5;
    Mfs_ManStop(p);
  }
  return iVar4;
}

Assistant:

int Abc_NtkMfs( Abc_Ntk_t * pNtk, Mfs_Par_t * pPars )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );

    Bdc_Par_t Pars = {0}, * pDecPars = &Pars;
    ProgressBar * pProgress;
    Mfs_Man_t * p;
    Abc_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    Vec_Ptr_t * vNodes;
    int i, k, nNodes, nFaninMax;
    abctime clk = Abc_Clock(), clk2;
    int nTotalNodesBeg = Abc_NtkNodeNum(pNtk);
    int nTotalEdgesBeg = Abc_NtkGetTotalFanins(pNtk);

    assert( Abc_NtkIsLogic(pNtk) );
    nFaninMax = Abc_NtkGetFaninMax(pNtk);
    if ( pPars->fResub )
    {
        if ( nFaninMax > 8 )
        {
            printf( "Nodes with more than %d fanins will not be processed.\n", 8 );
            nFaninMax = 8;
        }
    }
    else
    {
        if ( nFaninMax > MFS_FANIN_MAX )
        {
            printf( "Nodes with more than %d fanins will not be processed.\n", MFS_FANIN_MAX );
            nFaninMax = MFS_FANIN_MAX;
        }
    }
    // perform the network sweep
//    Abc_NtkSweep( pNtk, 0 );
    // convert into the AIG
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to AIGs has failed.\n" );
        return 0;
    }
    assert( Abc_NtkHasAig(pNtk) );

    // start the manager
    p = Mfs_ManAlloc( pPars );
    p->pNtk = pNtk;
    p->nFaninMax = nFaninMax;

    // precomputer power-aware metrics
    if ( pPars->fPower )
    {
        extern Vec_Int_t * Abc_NtkPowerEstimate( Abc_Ntk_t * pNtk, int fProbOne );
        if ( pPars->fResub )
            p->vProbs = Abc_NtkPowerEstimate( pNtk, 0 );
        else
            p->vProbs = Abc_NtkPowerEstimate( pNtk, 1 );
#if 0
        printf( "Total switching before = %7.2f.\n", Abc_NtkMfsTotalSwitching(pNtk) );
#else
		p->TotalSwitchingBeg = Abc_NtkMfsTotalSwitching(pNtk);
#endif
    }

    if ( pNtk->pExcare )
    {
        Abc_Ntk_t * pTemp;
        if ( Abc_NtkPiNum((Abc_Ntk_t *)pNtk->pExcare) != Abc_NtkCiNum(pNtk) )
            printf( "The PI count of careset (%d) and logic network (%d) differ. Careset is not used.\n",
                Abc_NtkPiNum((Abc_Ntk_t *)pNtk->pExcare), Abc_NtkCiNum(pNtk) );
        else
        {
            pTemp = Abc_NtkStrash( (Abc_Ntk_t *)pNtk->pExcare, 0, 0, 0 );
            p->pCare = Abc_NtkToDar( pTemp, 0, 0 );
            Abc_NtkDelete( pTemp );
            p->vSuppsInv = Aig_ManSupportsInverse( p->pCare );
        }
    }
    if ( p->pCare != NULL )
        printf( "Performing optimization with %d external care clauses.\n", Aig_ManCoNum(p->pCare) );
    // prepare the BDC manager
    if ( !pPars->fResub )
    {
        pDecPars->nVarsMax = (nFaninMax < 3) ? 3 : nFaninMax;
        pDecPars->fVerbose = pPars->fVerbose;
        p->vTruth = Vec_IntAlloc( 0 );
        p->pManDec = Bdc_ManAlloc( pDecPars );
    }

    // label the register outputs
    if ( p->pCare )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->pData = (void *)(ABC_PTRUINT_T)i;
    }

    // compute levels
    Abc_NtkLevel( pNtk );
    Abc_NtkStartReverseLevels( pNtk, pPars->nGrowthLevel );

    // compute don't-cares for each node
    nNodes = 0;
    p->nTotalNodesBeg = nTotalNodesBeg;
    p->nTotalEdgesBeg = nTotalEdgesBeg;
    if ( pPars->fResub )
    {
#if 0
        printf( "TotalSwitching (%7.2f --> ", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
		if (pPars->fPower)
		{
			Abc_NtkMfsPowerResub( p, pPars);
		} else
		{
        pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
        Abc_NtkForEachNode( pNtk, pObj, i )
        {
            if ( p->pPars->nDepthMax && (int)pObj->Level > p->pPars->nDepthMax )
                continue;
            if ( Abc_ObjFaninNum(pObj) < 2 || Abc_ObjFaninNum(pObj) > nFaninMax )
                continue;
            if ( !p->pPars->fVeryVerbose )
                Extra_ProgressBarUpdate( pProgress, i, NULL );
            if ( pPars->fResub )
                Abc_NtkMfsResub( p, pObj );
            else
                Abc_NtkMfsNode( p, pObj );
        }
        Extra_ProgressBarStop( pProgress );
#if 0
        printf( " %7.2f )\n", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
    }
	} else
    {
#if 0
        printf( "Total switching before  = %7.2f,  ----> ", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
        pProgress = Extra_ProgressBarStart( stdout, Abc_NtkNodeNum(pNtk) );
        vLevels = Abc_NtkLevelize( pNtk );
        Vec_VecForEachLevelStart( vLevels, vNodes, k, 1 )
        {
            if ( !p->pPars->fVeryVerbose )
                Extra_ProgressBarUpdate( pProgress, nNodes, NULL );
            p->nNodesGainedLevel = 0;
            p->nTotConfLevel = 0;
            p->nTimeOutsLevel = 0;
            clk2 = Abc_Clock();
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            {
                if ( p->pPars->nDepthMax && (int)pObj->Level > p->pPars->nDepthMax )
                    break;
                if ( Abc_ObjFaninNum(pObj) < 2 || Abc_ObjFaninNum(pObj) > nFaninMax )
                    continue;
                if ( pPars->fResub )
                    Abc_NtkMfsResub( p, pObj );
                else
                    Abc_NtkMfsNode( p, pObj );
            }
            nNodes += Vec_PtrSize(vNodes);
            if ( pPars->fVerbose )
            {
				/*
            printf( "Lev = %2d. Node = %5d. Ave gain = %5.2f. Ave conf = %5.2f. T/o = %6.2f %%  ",
                k, Vec_PtrSize(vNodes),
                1.0*p->nNodesGainedLevel/Vec_PtrSize(vNodes),
                1.0*p->nTotConfLevel/Vec_PtrSize(vNodes),
                100.0*p->nTimeOutsLevel/Vec_PtrSize(vNodes) );
            ABC_PRT( "Time", Abc_Clock() - clk2 );
			*/
            }
        }
        Extra_ProgressBarStop( pProgress );
        Vec_VecFree( vLevels );
#if 0
        printf( " %7.2f.\n", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
    }
    Abc_NtkStopReverseLevels( pNtk );

    // perform the sweeping
    if ( !pPars->fResub )
    {
        extern void Abc_NtkBidecResyn( Abc_Ntk_t * pNtk, int fVerbose );
//        Abc_NtkSweep( pNtk, 0 );
//        Abc_NtkBidecResyn( pNtk, 0 );
    }

    p->nTotalNodesEnd = Abc_NtkNodeNum(pNtk);
    p->nTotalEdgesEnd = Abc_NtkGetTotalFanins(pNtk);

    // undo labesl
    if ( p->pCare )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->pData = NULL;
    }

    if ( pPars->fPower )
	{
#if 1
		p->TotalSwitchingEnd = Abc_NtkMfsTotalSwitching(pNtk);
//        printf( "Total switching after  = %7.2f.\n", Abc_NtkMfsTotalSwitching(pNtk) );
#else
        printf( "Total switching after  = %7.2f.\n", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
	}

    // free the manager
    p->timeTotal = Abc_Clock() - clk;
    Mfs_ManStop( p );
    return 1;
}